

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::
     genericCheckTestMessageAllZero<capnproto_test::capnp::test::TestAllTypes::Builder>
               (Builder reader)

{
  bool bVar1;
  int8_t iVar2;
  uint8_t uVar3;
  int16_t iVar4;
  uint16_t uVar5;
  int32_t iVar6;
  uint32_t uVar7;
  uint uVar8;
  int64_t iVar9;
  uint64_t uVar10;
  float fVar11;
  double dVar12;
  Builder local_e68;
  uint local_e3c;
  uint local_e38;
  bool local_e31;
  undefined1 local_e30 [7];
  bool _kj_shouldLog_59;
  Builder local_e08;
  uint local_ddc;
  uint local_dd8;
  bool local_dd1;
  undefined1 local_dd0 [7];
  bool _kj_shouldLog_58;
  Builder local_da8;
  uint local_d7c;
  uint local_d78;
  bool local_d71;
  undefined1 local_d70 [7];
  bool _kj_shouldLog_57;
  Builder local_d48;
  uint local_d1c;
  uint local_d18;
  bool local_d11;
  undefined1 local_d10 [7];
  bool _kj_shouldLog_56;
  Builder local_ce8;
  uint local_cbc;
  uint local_cb8;
  bool local_cb1;
  undefined1 local_cb0 [7];
  bool _kj_shouldLog_55;
  Builder local_c88;
  uint local_c5c;
  uint local_c58;
  bool local_c51;
  undefined1 local_c50 [7];
  bool _kj_shouldLog_54;
  Builder local_c28;
  uint local_bfc;
  uint local_bf8;
  bool local_bf1;
  undefined1 local_bf0 [7];
  bool _kj_shouldLog_53;
  Builder local_bc8;
  uint local_b9c;
  uint local_b98;
  bool local_b91;
  undefined1 local_b90 [7];
  bool _kj_shouldLog_52;
  Builder local_b68;
  uint local_b3c;
  uint local_b38;
  bool local_b31;
  undefined1 local_b30 [7];
  bool _kj_shouldLog_51;
  Builder local_b08;
  uint local_adc;
  uint local_ad8;
  bool local_ad1;
  undefined1 local_ad0 [7];
  bool _kj_shouldLog_50;
  Builder local_aa8;
  uint local_a7c;
  uint local_a78;
  bool local_a71;
  undefined1 local_a70 [7];
  bool _kj_shouldLog_49;
  Builder local_a48;
  uint local_a1c;
  uint local_a18;
  bool local_a11;
  undefined1 local_a10 [7];
  bool _kj_shouldLog_48;
  Builder local_9e8;
  uint local_9bc;
  uint local_9b8;
  bool local_9b1;
  undefined1 local_9b0 [7];
  bool _kj_shouldLog_47;
  Builder local_988;
  uint local_95c;
  uint local_958;
  bool local_951;
  undefined1 local_950 [7];
  bool _kj_shouldLog_46;
  Builder local_928;
  uint local_8fc;
  uint local_8f8;
  bool local_8f1;
  undefined1 local_8f0 [7];
  bool _kj_shouldLog_45;
  Builder local_8c8;
  uint local_89c;
  uint local_898;
  bool local_891;
  undefined1 local_890 [7];
  bool _kj_shouldLog_44;
  Builder local_868;
  uint local_83c;
  uint local_838;
  bool local_831;
  undefined1 local_830 [7];
  bool _kj_shouldLog_43;
  Builder local_808;
  uint local_7dc;
  uint local_7d8;
  bool local_7d1;
  undefined1 local_7d0 [7];
  bool _kj_shouldLog_42;
  Builder local_7a8;
  uint local_77c;
  uint local_778;
  bool local_771;
  undefined1 local_770 [7];
  bool _kj_shouldLog_41;
  Builder local_748;
  uint local_71c;
  uint local_718;
  bool local_711;
  undefined1 local_710 [7];
  bool _kj_shouldLog_40;
  Builder local_6e8;
  uint local_6bc;
  uint local_6b8;
  bool local_6b1;
  undefined1 local_6b0 [7];
  bool _kj_shouldLog_39;
  Builder local_688;
  uint local_65c;
  uint local_658;
  bool local_651;
  undefined1 local_650 [7];
  bool _kj_shouldLog_38;
  Builder local_628;
  uint local_5fc;
  uint local_5f8;
  bool local_5f1;
  undefined1 local_5f0 [7];
  bool _kj_shouldLog_37;
  Builder local_5c8;
  uint local_59c;
  uint local_598;
  bool local_591;
  undefined1 local_590 [7];
  bool _kj_shouldLog_36;
  Builder local_568;
  uint local_53c;
  uint local_538;
  bool local_531;
  undefined1 local_530 [7];
  bool _kj_shouldLog_35;
  Builder local_508;
  uint local_4dc;
  uint local_4d8;
  bool local_4d1;
  undefined1 local_4d0 [7];
  bool _kj_shouldLog_34;
  Builder local_4a8;
  uint local_47c;
  uint local_478;
  bool local_471;
  undefined1 local_470 [7];
  bool _kj_shouldLog_33;
  Builder local_448;
  uint local_41c;
  uint local_418;
  bool local_411;
  undefined1 local_410 [7];
  bool _kj_shouldLog_32;
  Builder local_3e8;
  uint local_3bc;
  uint local_3b8;
  bool local_3b1;
  undefined1 local_3b0 [7];
  bool _kj_shouldLog_31;
  Builder local_388;
  uint local_35c;
  uint local_358;
  bool local_351;
  undefined1 local_350 [7];
  bool _kj_shouldLog_30;
  Builder local_328;
  Builder local_300;
  bool local_2e1;
  undefined1 local_2e0 [7];
  bool _kj_shouldLog_29;
  Builder local_2b8;
  Builder local_2a0;
  bool local_281;
  undefined1 local_280 [7];
  bool _kj_shouldLog_28;
  undefined1 local_268 [8];
  Builder subSubReader;
  ArrayPtr<const_unsigned_char> local_230;
  bool local_219;
  undefined1 auStack_218 [7];
  bool _kj_shouldLog_27;
  ArrayPtr<const_unsigned_char> local_208;
  Builder local_1f8;
  bool local_1d9;
  undefined1 local_1d8 [7];
  bool _kj_shouldLog_26;
  int local_1bc;
  double local_1b8;
  bool local_1ad;
  int local_1ac;
  float fStack_1a8;
  bool _kj_shouldLog_25;
  bool local_1a1;
  uint64_t uStack_1a0;
  bool _kj_shouldLog_24;
  uint local_194;
  bool local_18d;
  uint32_t local_18c;
  uint uStack_188;
  bool _kj_shouldLog_23;
  bool local_183;
  uint16_t local_182;
  uint local_180;
  bool _kj_shouldLog_22;
  bool local_17a;
  uint8_t local_179;
  uint local_178;
  bool _kj_shouldLog_21;
  bool local_171;
  int64_t iStack_170;
  bool _kj_shouldLog_20;
  int local_164;
  bool local_15d;
  int32_t local_15c;
  int iStack_158;
  bool _kj_shouldLog_19;
  bool local_153;
  int16_t local_152;
  int local_150;
  bool _kj_shouldLog_18;
  bool local_14a;
  int8_t local_149;
  int local_148;
  bool _kj_shouldLog_17;
  bool local_141;
  bool local_140;
  bool local_13f;
  bool local_13e;
  Void local_13c;
  bool local_13b;
  bool _kj_shouldLog_16;
  undefined1 local_138 [2];
  bool _kj_shouldLog_15;
  bool _kj_shouldLog_14;
  Builder subReader;
  ArrayPtr<const_unsigned_char> local_100;
  bool local_e9;
  undefined1 auStack_e8 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_unsigned_char> local_d8;
  Builder local_c8;
  bool local_a9;
  undefined1 local_a8 [7];
  bool _kj_shouldLog_12;
  int local_8c;
  double local_88;
  bool local_7d;
  int local_7c;
  float fStack_78;
  bool _kj_shouldLog_11;
  bool local_71;
  uint64_t uStack_70;
  bool _kj_shouldLog_10;
  uint local_64;
  bool local_5d;
  uint32_t local_5c;
  uint uStack_58;
  bool _kj_shouldLog_9;
  bool local_53;
  uint16_t local_52;
  uint local_50;
  bool _kj_shouldLog_8;
  bool local_4a;
  uint8_t local_49;
  uint local_48;
  bool _kj_shouldLog_7;
  bool local_41;
  int64_t iStack_40;
  bool _kj_shouldLog_6;
  int local_34;
  bool local_2d;
  int32_t local_2c;
  int iStack_28;
  bool _kj_shouldLog_5;
  bool local_23;
  int16_t local_22;
  int local_20;
  bool _kj_shouldLog_4;
  bool local_1a;
  int8_t local_19;
  int local_18;
  bool _kj_shouldLog_3;
  bool local_11;
  bool local_10;
  bool local_f;
  bool local_e;
  Void local_c;
  bool local_b;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField((Builder *)&stack0x00000008);
  bVar1 = Void::operator==((Void *)&VOID);
  if (!bVar1) {
    local_b = kj::_::Debug::shouldLog(ERROR);
    while (local_b != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1be,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.getVoidField())\", VOID, reader.getVoidField()"
                 ,(char (*) [51])"failed: expected (VOID) == (reader.getVoidField())",(Void *)&VOID,
                 &local_c);
      local_b = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField
                    ((Builder *)&stack0x00000008);
  if (bVar1) {
    local_e = kj::_::Debug::shouldLog(ERROR);
    while (local_e != false) {
      local_f = false;
      local_10 = capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[52],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1bf,ERROR,
                 "\"failed: expected \" \"(false) == (reader.getBoolField())\", false, reader.getBoolField()"
                 ,(char (*) [52])"failed: expected (false) == (reader.getBoolField())",&local_f,
                 &local_10);
      local_e = false;
    }
  }
  iVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                    ((Builder *)&stack0x00000008);
  if (iVar2 != '\0') {
    local_11 = kj::_::Debug::shouldLog(ERROR);
    while (local_11 != false) {
      local_18 = 0;
      local_19 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[48],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c0,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt8Field())\", 0, reader.getInt8Field()"
                 ,(char (*) [48])"failed: expected (0) == (reader.getInt8Field())",&local_18,
                 &local_19);
      local_11 = false;
    }
  }
  iVar4 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                    ((Builder *)&stack0x00000008);
  if (iVar4 != 0) {
    local_1a = kj::_::Debug::shouldLog(ERROR);
    while (local_1a != false) {
      local_20 = 0;
      local_22 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c1,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt16Field())\", 0, reader.getInt16Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt16Field())",&local_20,
                 &local_22);
      local_1a = false;
    }
  }
  iVar6 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                    ((Builder *)&stack0x00000008);
  if (iVar6 != 0) {
    local_23 = kj::_::Debug::shouldLog(ERROR);
    while (local_23 != false) {
      iStack_28 = 0;
      local_2c = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c2,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt32Field())\", 0, reader.getInt32Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt32Field())",
                 &stack0xffffffffffffffd8,&local_2c);
      local_23 = false;
    }
  }
  iVar9 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                    ((Builder *)&stack0x00000008);
  if (iVar9 != 0) {
    local_2d = kj::_::Debug::shouldLog(ERROR);
    while (local_2d != false) {
      local_34 = 0;
      iStack_40 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                            ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c3,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt64Field())\", 0, reader.getInt64Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt64Field())",&local_34,
                 &stack0xffffffffffffffc0);
      local_2d = false;
    }
  }
  uVar3 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                    ((Builder *)&stack0x00000008);
  if (uVar3 != '\0') {
    local_41 = kj::_::Debug::shouldLog(ERROR);
    while (local_41 != false) {
      local_48 = 0;
      local_49 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[50],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c4,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt8Field())\", 0u, reader.getUInt8Field()"
                 ,(char (*) [50])"failed: expected (0u) == (reader.getUInt8Field())",&local_48,
                 &local_49);
      local_41 = false;
    }
  }
  uVar5 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                    ((Builder *)&stack0x00000008);
  if (uVar5 != 0) {
    local_4a = kj::_::Debug::shouldLog(ERROR);
    while (local_4a != false) {
      local_50 = 0;
      local_52 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c5,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt16Field())\", 0u, reader.getUInt16Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt16Field())",&local_50,
                 &local_52);
      local_4a = false;
    }
  }
  uVar7 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                    ((Builder *)&stack0x00000008);
  if (uVar7 != 0) {
    local_53 = kj::_::Debug::shouldLog(ERROR);
    while (local_53 != false) {
      uStack_58 = 0;
      local_5c = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c6,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt32Field())\", 0u, reader.getUInt32Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt32Field())",
                 &stack0xffffffffffffffa8,&local_5c);
      local_53 = false;
    }
  }
  uVar10 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                     ((Builder *)&stack0x00000008);
  if (uVar10 != 0) {
    local_5d = kj::_::Debug::shouldLog(ERROR);
    while (local_5d != false) {
      local_64 = 0;
      uStack_70 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                            ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c7,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt64Field())\", 0u, reader.getUInt64Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt64Field())",&local_64,
                 &stack0xffffffffffffff90);
      local_5d = false;
    }
  }
  fVar11 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                     ((Builder *)&stack0x00000008);
  bVar1 = kj::_::floatAlmostEqual(fVar11,0.0);
  if (!bVar1) {
    local_71 = kj::_::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      fStack_78 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                            ((Builder *)&stack0x00000008);
      local_7c = 0;
      kj::_::Debug::log<char_const(&)[72],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c8,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)\", reader.getFloat32Field(), 0"
                 ,(char (*) [72])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)",
                 &stack0xffffffffffffff88,&local_7c);
      local_71 = false;
    }
  }
  dVar12 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                     ((Builder *)&stack0x00000008);
  bVar1 = kj::_::doubleAlmostEqual(dVar12,0.0);
  if (!bVar1) {
    local_7d = kj::_::Debug::shouldLog(ERROR);
    while (local_7d != false) {
      local_88 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                           ((Builder *)&stack0x00000008);
      local_8c = 0;
      kj::_::Debug::log<char_const(&)[73],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c9,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)\", reader.getFloat64Field(), 0"
                 ,(char (*) [73])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)",
                 &local_88,&local_8c);
      local_7d = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_a8,(Builder *)&stack0x00000008);
  bVar1 = capnp::operator==("",(Builder *)local_a8);
  if (!bVar1) {
    local_a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_a9 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_c8,(Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ca,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (reader.getTextField())\", \"\", reader.getTextField()"
                 ,(char (*) [49])"failed: expected (\"\") == (reader.getTextField())",
                 (char (*) [1])0xa68054,&local_c8);
      local_a9 = false;
    }
  }
  local_d8 = (ArrayPtr<const_unsigned_char>)_::data("");
  _auStack_e8 = (ArrayPtr<unsigned_char>)
                capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                          ((Builder *)&stack0x00000008);
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_d8,
                     (ArrayPtr<unsigned_char> *)auStack_e8);
  if (!bVar1) {
    local_e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_e9 != false) {
      local_100 = (ArrayPtr<const_unsigned_char>)_::data("");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[55],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cb,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (reader.getDataField())\", data(\"\"), reader.getDataField()"
                 ,(char (*) [55])"failed: expected (data(\"\")) == (reader.getDataField())",
                 (Reader *)&local_100,(Builder *)&subReader._builder.dataSize);
      local_e9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)local_138,(Builder *)&stack0x00000008);
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField((Builder *)local_138);
  bVar1 = Void::operator==((Void *)&VOID);
  if (!bVar1) {
    local_13b = kj::_::Debug::shouldLog(ERROR);
    while (local_13b != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[54],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ce,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.getVoidField())\", VOID, subReader.getVoidField()"
                 ,(char (*) [54])"failed: expected (VOID) == (subReader.getVoidField())",
                 (Void *)&VOID,&local_13c);
      local_13b = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField((Builder *)local_138);
  if (bVar1) {
    local_13e = kj::_::Debug::shouldLog(ERROR);
    while (local_13e != false) {
      local_13f = false;
      local_140 = capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[55],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cf,ERROR,
                 "\"failed: expected \" \"(false) == (subReader.getBoolField())\", false, subReader.getBoolField()"
                 ,(char (*) [55])"failed: expected (false) == (subReader.getBoolField())",&local_13f
                 ,&local_140);
      local_13e = false;
    }
  }
  iVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field((Builder *)local_138);
  if (iVar2 != '\0') {
    local_141 = kj::_::Debug::shouldLog(ERROR);
    while (local_141 != false) {
      local_148 = 0;
      local_149 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[51],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d0,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt8Field())\", 0, subReader.getInt8Field()"
                 ,(char (*) [51])"failed: expected (0) == (subReader.getInt8Field())",&local_148,
                 &local_149);
      local_141 = false;
    }
  }
  iVar4 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field((Builder *)local_138);
  if (iVar4 != 0) {
    local_14a = kj::_::Debug::shouldLog(ERROR);
    while (local_14a != false) {
      local_150 = 0;
      local_152 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[52],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d1,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt16Field())\", 0, subReader.getInt16Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt16Field())",&local_150,
                 &local_152);
      local_14a = false;
    }
  }
  iVar6 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field((Builder *)local_138);
  if (iVar6 != 0) {
    local_153 = kj::_::Debug::shouldLog(ERROR);
    while (local_153 != false) {
      iStack_158 = 0;
      local_15c = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[52],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d2,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt32Field())\", 0, subReader.getInt32Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt32Field())",
                 &stack0xfffffffffffffea8,&local_15c);
      local_153 = false;
    }
  }
  iVar9 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field((Builder *)local_138);
  if (iVar9 != 0) {
    local_15d = kj::_::Debug::shouldLog(ERROR);
    while (local_15d != false) {
      local_164 = 0;
      iStack_170 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                             ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[52],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d3,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt64Field())\", 0, subReader.getInt64Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt64Field())",&local_164,
                 &stack0xfffffffffffffe90);
      local_15d = false;
    }
  }
  uVar3 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field((Builder *)local_138);
  if (uVar3 != '\0') {
    local_171 = kj::_::Debug::shouldLog(ERROR);
    while (local_171 != false) {
      local_178 = 0;
      local_179 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[53],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d4,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt8Field())\", 0u, subReader.getUInt8Field()"
                 ,(char (*) [53])"failed: expected (0u) == (subReader.getUInt8Field())",&local_178,
                 &local_179);
      local_171 = false;
    }
  }
  uVar5 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field((Builder *)local_138);
  if (uVar5 != 0) {
    local_17a = kj::_::Debug::shouldLog(ERROR);
    while (local_17a != false) {
      local_180 = 0;
      local_182 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d5,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt16Field())\", 0u, subReader.getUInt16Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt16Field())",&local_180,
                 &local_182);
      local_17a = false;
    }
  }
  uVar7 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field((Builder *)local_138);
  if (uVar7 != 0) {
    local_183 = kj::_::Debug::shouldLog(ERROR);
    while (local_183 != false) {
      uStack_188 = 0;
      local_18c = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d6,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt32Field())\", 0u, subReader.getUInt32Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt32Field())",
                 &stack0xfffffffffffffe78,&local_18c);
      local_183 = false;
    }
  }
  uVar10 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field((Builder *)local_138);
  if (uVar10 != 0) {
    local_18d = kj::_::Debug::shouldLog(ERROR);
    while (local_18d != false) {
      local_194 = 0;
      uStack_1a0 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                             ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d7,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt64Field())\", 0u, subReader.getUInt64Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt64Field())",&local_194,
                 &stack0xfffffffffffffe60);
      local_18d = false;
    }
  }
  fVar11 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field((Builder *)local_138)
  ;
  bVar1 = kj::_::floatAlmostEqual(fVar11,0.0);
  if (!bVar1) {
    local_1a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a1 != false) {
      fStack_1a8 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                             ((Builder *)local_138);
      local_1ac = 0;
      kj::_::Debug::log<char_const(&)[75],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d8,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)\", subReader.getFloat32Field(), 0"
                 ,(char (*) [75])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)",
                 &stack0xfffffffffffffe58,&local_1ac);
      local_1a1 = false;
    }
  }
  dVar12 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field((Builder *)local_138)
  ;
  bVar1 = kj::_::doubleAlmostEqual(dVar12,0.0);
  if (!bVar1) {
    local_1ad = kj::_::Debug::shouldLog(ERROR);
    while (local_1ad != false) {
      local_1b8 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                            ((Builder *)local_138);
      local_1bc = 0;
      kj::_::Debug::log<char_const(&)[76],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d9,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)\", subReader.getFloat64Field(), 0"
                 ,(char (*) [76])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)",
                 &local_1b8,&local_1bc);
      local_1ad = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_1d8,(Builder *)local_138);
  bVar1 = capnp::operator==("",(Builder *)local_1d8);
  if (!bVar1) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_1f8,(Builder *)local_138);
      kj::_::Debug::log<char_const(&)[52],char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1da,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subReader.getTextField())\", \"\", subReader.getTextField()"
                 ,(char (*) [52])"failed: expected (\"\") == (subReader.getTextField())",
                 (char (*) [1])0xa68054,&local_1f8);
      local_1d9 = false;
    }
  }
  local_208 = (ArrayPtr<const_unsigned_char>)_::data("");
  _auStack_218 = (ArrayPtr<unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                           ((Builder *)local_138);
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_208,
                     (ArrayPtr<unsigned_char> *)auStack_218);
  if (!bVar1) {
    local_219 = kj::_::Debug::shouldLog(ERROR);
    while (local_219 != false) {
      local_230 = (ArrayPtr<const_unsigned_char>)_::data("");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Builder::getDataField((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[58],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1db,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.getDataField())\", data(\"\"), subReader.getDataField()"
                 ,(char (*) [58])"failed: expected (data(\"\")) == (subReader.getDataField())",
                 (Reader *)&local_230,(Builder *)&subSubReader._builder.dataSize);
      local_219 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)local_268,(Builder *)local_138);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_280,(Builder *)local_268);
  bVar1 = capnp::operator==("",(Builder *)local_280);
  if (!bVar1) {
    local_281 = kj::_::Debug::shouldLog(ERROR);
    while (local_281 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_2a0,(Builder *)local_268);
      kj::_::Debug::log<char_const(&)[55],char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1de,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getTextField())\", \"\", subSubReader.getTextField()"
                 ,(char (*) [55])"failed: expected (\"\") == (subSubReader.getTextField())",
                 (char (*) [1])0xa68054,&local_2a0);
      local_281 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)local_2e0,(Builder *)local_268);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_2b8,(Builder *)local_2e0);
  bVar1 = capnp::operator==("",&local_2b8);
  if (!bVar1) {
    local_2e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e1 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
                (&local_328,(Builder *)local_268);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_300,&local_328);
      kj::_::Debug::log<char_const(&)[72],char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1df,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getStructField().getTextField())\", \"\", subSubReader.getStructField().getTextField()"
                 ,(char (*) [72])
                  "failed: expected (\"\") == (subSubReader.getStructField().getTextField())",
                 (char (*) [1])0xa68054,&local_300);
      local_2e1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)local_350,(Builder *)local_138);
  uVar8 = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_350);
  if (uVar8 != 0) {
    local_351 = kj::_::Debug::shouldLog(ERROR);
    while (local_351 != false) {
      local_358 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
                (&local_388,(Builder *)local_138);
      local_35c = List<capnp::Void,_(capnp::Kind)0>::Builder::size(&local_388);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e2,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getVoidList().size())\", 0u, subReader.getVoidList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getVoidList().size())",
                 &local_358,&local_35c);
      local_351 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)local_3b0,(Builder *)local_138);
  uVar8 = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_3b0);
  if (uVar8 != 0) {
    local_3b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3b1 != false) {
      local_3b8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
                (&local_3e8,(Builder *)local_138);
      local_3bc = List<bool,_(capnp::Kind)0>::Builder::size(&local_3e8);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e3,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getBoolList().size())\", 0u, subReader.getBoolList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getBoolList().size())",
                 &local_3b8,&local_3bc);
      local_3b1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)local_410,(Builder *)local_138);
  uVar8 = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_410);
  if (uVar8 != 0) {
    local_411 = kj::_::Debug::shouldLog(ERROR);
    while (local_411 != false) {
      local_418 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
                (&local_448,(Builder *)local_138);
      local_41c = List<signed_char,_(capnp::Kind)0>::Builder::size(&local_448);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e4,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt8List().size())\", 0u, subReader.getInt8List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getInt8List().size())",
                 &local_418,&local_41c);
      local_411 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)local_470,(Builder *)local_138);
  uVar8 = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_470);
  if (uVar8 != 0) {
    local_471 = kj::_::Debug::shouldLog(ERROR);
    while (local_471 != false) {
      local_478 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
                (&local_4a8,(Builder *)local_138);
      local_47c = List<short,_(capnp::Kind)0>::Builder::size(&local_4a8);
      kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e5,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt16List().size())\", 0u, subReader.getInt16List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt16List().size())",
                 &local_478,&local_47c);
      local_471 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)local_4d0,(Builder *)local_138);
  uVar8 = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_4d0);
  if (uVar8 != 0) {
    local_4d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4d1 != false) {
      local_4d8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
                (&local_508,(Builder *)local_138);
      local_4dc = List<int,_(capnp::Kind)0>::Builder::size(&local_508);
      kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e6,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt32List().size())\", 0u, subReader.getInt32List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt32List().size())",
                 &local_4d8,&local_4dc);
      local_4d1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)local_530,(Builder *)local_138);
  uVar8 = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_530);
  if (uVar8 != 0) {
    local_531 = kj::_::Debug::shouldLog(ERROR);
    while (local_531 != false) {
      local_538 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
                (&local_568,(Builder *)local_138);
      local_53c = List<long,_(capnp::Kind)0>::Builder::size(&local_568);
      kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e7,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt64List().size())\", 0u, subReader.getInt64List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt64List().size())",
                 &local_538,&local_53c);
      local_531 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)local_590,(Builder *)local_138);
  uVar8 = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_590);
  if (uVar8 != 0) {
    local_591 = kj::_::Debug::shouldLog(ERROR);
    while (local_591 != false) {
      local_598 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
                (&local_5c8,(Builder *)local_138);
      local_59c = List<unsigned_char,_(capnp::Kind)0>::Builder::size(&local_5c8);
      kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e8,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt8List().size())\", 0u, subReader.getUInt8List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getUInt8List().size())",
                 &local_598,&local_59c);
      local_591 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)local_5f0,(Builder *)local_138);
  uVar8 = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_5f0);
  if (uVar8 != 0) {
    local_5f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5f1 != false) {
      local_5f8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
                (&local_628,(Builder *)local_138);
      local_5fc = List<unsigned_short,_(capnp::Kind)0>::Builder::size(&local_628);
      kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e9,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt16List().size())\", 0u, subReader.getUInt16List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt16List().size())",
                 &local_5f8,&local_5fc);
      local_5f1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)local_650,(Builder *)local_138);
  uVar8 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_650);
  if (uVar8 != 0) {
    local_651 = kj::_::Debug::shouldLog(ERROR);
    while (local_651 != false) {
      local_658 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
                (&local_688,(Builder *)local_138);
      local_65c = List<unsigned_int,_(capnp::Kind)0>::Builder::size(&local_688);
      kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ea,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt32List().size())\", 0u, subReader.getUInt32List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt32List().size())",
                 &local_658,&local_65c);
      local_651 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)local_6b0,(Builder *)local_138);
  uVar8 = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_6b0);
  if (uVar8 != 0) {
    local_6b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6b1 != false) {
      local_6b8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
                (&local_6e8,(Builder *)local_138);
      local_6bc = List<unsigned_long,_(capnp::Kind)0>::Builder::size(&local_6e8);
      kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1eb,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt64List().size())\", 0u, subReader.getUInt64List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt64List().size())",
                 &local_6b8,&local_6bc);
      local_6b1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)local_710,(Builder *)local_138);
  uVar8 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_710);
  if (uVar8 != 0) {
    local_711 = kj::_::Debug::shouldLog(ERROR);
    while (local_711 != false) {
      local_718 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
                (&local_748,(Builder *)local_138);
      local_71c = List<float,_(capnp::Kind)0>::Builder::size(&local_748);
      kj::_::Debug::log<char_const(&)[61],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ec,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getFloat32List().size())\", 0u, subReader.getFloat32List().size()"
                 ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat32List().size())",
                 &local_718,&local_71c);
      local_711 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)local_770,(Builder *)local_138);
  uVar8 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_770);
  if (uVar8 != 0) {
    local_771 = kj::_::Debug::shouldLog(ERROR);
    while (local_771 != false) {
      local_778 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
                (&local_7a8,(Builder *)local_138);
      local_77c = List<double,_(capnp::Kind)0>::Builder::size(&local_7a8);
      kj::_::Debug::log<char_const(&)[61],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ed,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getFloat64List().size())\", 0u, subReader.getFloat64List().size()"
                 ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat64List().size())",
                 &local_778,&local_77c);
      local_771 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)local_7d0,(Builder *)local_138);
  uVar8 = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_7d0);
  if (uVar8 != 0) {
    local_7d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7d1 != false) {
      local_7d8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
                (&local_808,(Builder *)local_138);
      local_7dc = List<capnp::Text,_(capnp::Kind)1>::Builder::size(&local_808);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ee,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getTextList().size())\", 0u, subReader.getTextList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getTextList().size())",
                 &local_7d8,&local_7dc);
      local_7d1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)local_830,(Builder *)local_138);
  uVar8 = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_830);
  if (uVar8 != 0) {
    local_831 = kj::_::Debug::shouldLog(ERROR);
    while (local_831 != false) {
      local_838 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
                (&local_868,(Builder *)local_138);
      local_83c = List<capnp::Data,_(capnp::Kind)1>::Builder::size(&local_868);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ef,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getDataList().size())\", 0u, subReader.getDataList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getDataList().size())",
                 &local_838,&local_83c);
      local_831 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)local_890,(Builder *)local_138);
  uVar8 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_890);
  if (uVar8 != 0) {
    local_891 = kj::_::Debug::shouldLog(ERROR);
    while (local_891 != false) {
      local_898 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
                (&local_8c8,(Builder *)local_138);
      local_89c = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                            (&local_8c8);
      kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f0,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getStructList().size())\", 0u, subReader.getStructList().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getStructList().size())",
                 &local_898,&local_89c);
      local_891 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)local_8f0,(Builder *)&stack0x00000008);
  uVar8 = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_8f0);
  if (uVar8 != 0) {
    local_8f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8f1 != false) {
      local_8f8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
                (&local_928,(Builder *)&stack0x00000008);
      local_8fc = List<capnp::Void,_(capnp::Kind)0>::Builder::size(&local_928);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,499,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getVoidList().size())\", 0u, reader.getVoidList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getVoidList().size())",&local_8f8
                 ,&local_8fc);
      local_8f1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)local_950,(Builder *)&stack0x00000008);
  uVar8 = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_950);
  if (uVar8 != 0) {
    local_951 = kj::_::Debug::shouldLog(ERROR);
    while (local_951 != false) {
      local_958 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
                (&local_988,(Builder *)&stack0x00000008);
      local_95c = List<bool,_(capnp::Kind)0>::Builder::size(&local_988);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,500,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getBoolList().size())\", 0u, reader.getBoolList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getBoolList().size())",&local_958
                 ,&local_95c);
      local_951 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)local_9b0,(Builder *)&stack0x00000008);
  uVar8 = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_9b0);
  if (uVar8 != 0) {
    local_9b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_9b1 != false) {
      local_9b8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
                (&local_9e8,(Builder *)&stack0x00000008);
      local_9bc = List<signed_char,_(capnp::Kind)0>::Builder::size(&local_9e8);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f5,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt8List().size())\", 0u, reader.getInt8List().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getInt8List().size())",&local_9b8
                 ,&local_9bc);
      local_9b1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)local_a10,(Builder *)&stack0x00000008);
  uVar8 = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_a10);
  if (uVar8 != 0) {
    local_a11 = kj::_::Debug::shouldLog(ERROR);
    while (local_a11 != false) {
      local_a18 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
                (&local_a48,(Builder *)&stack0x00000008);
      local_a1c = List<short,_(capnp::Kind)0>::Builder::size(&local_a48);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f6,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt16List().size())\", 0u, reader.getInt16List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt16List().size())",
                 &local_a18,&local_a1c);
      local_a11 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)local_a70,(Builder *)&stack0x00000008);
  uVar8 = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_a70);
  if (uVar8 != 0) {
    local_a71 = kj::_::Debug::shouldLog(ERROR);
    while (local_a71 != false) {
      local_a78 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
                (&local_aa8,(Builder *)&stack0x00000008);
      local_a7c = List<int,_(capnp::Kind)0>::Builder::size(&local_aa8);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f7,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt32List().size())\", 0u, reader.getInt32List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt32List().size())",
                 &local_a78,&local_a7c);
      local_a71 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)local_ad0,(Builder *)&stack0x00000008);
  uVar8 = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_ad0);
  if (uVar8 != 0) {
    local_ad1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ad1 != false) {
      local_ad8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
                (&local_b08,(Builder *)&stack0x00000008);
      local_adc = List<long,_(capnp::Kind)0>::Builder::size(&local_b08);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f8,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt64List().size())\", 0u, reader.getInt64List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt64List().size())",
                 &local_ad8,&local_adc);
      local_ad1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)local_b30,(Builder *)&stack0x00000008);
  uVar8 = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_b30);
  if (uVar8 != 0) {
    local_b31 = kj::_::Debug::shouldLog(ERROR);
    while (local_b31 != false) {
      local_b38 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
                (&local_b68,(Builder *)&stack0x00000008);
      local_b3c = List<unsigned_char,_(capnp::Kind)0>::Builder::size(&local_b68);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f9,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt8List().size())\", 0u, reader.getUInt8List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getUInt8List().size())",
                 &local_b38,&local_b3c);
      local_b31 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)local_b90,(Builder *)&stack0x00000008);
  uVar8 = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_b90);
  if (uVar8 != 0) {
    local_b91 = kj::_::Debug::shouldLog(ERROR);
    while (local_b91 != false) {
      local_b98 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
                (&local_bc8,(Builder *)&stack0x00000008);
      local_b9c = List<unsigned_short,_(capnp::Kind)0>::Builder::size(&local_bc8);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fa,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt16List().size())\", 0u, reader.getUInt16List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt16List().size())",
                 &local_b98,&local_b9c);
      local_b91 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)local_bf0,(Builder *)&stack0x00000008);
  uVar8 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_bf0);
  if (uVar8 != 0) {
    local_bf1 = kj::_::Debug::shouldLog(ERROR);
    while (local_bf1 != false) {
      local_bf8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
                (&local_c28,(Builder *)&stack0x00000008);
      local_bfc = List<unsigned_int,_(capnp::Kind)0>::Builder::size(&local_c28);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fb,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt32List().size())\", 0u, reader.getUInt32List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt32List().size())",
                 &local_bf8,&local_bfc);
      local_bf1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)local_c50,(Builder *)&stack0x00000008);
  uVar8 = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_c50);
  if (uVar8 != 0) {
    local_c51 = kj::_::Debug::shouldLog(ERROR);
    while (local_c51 != false) {
      local_c58 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
                (&local_c88,(Builder *)&stack0x00000008);
      local_c5c = List<unsigned_long,_(capnp::Kind)0>::Builder::size(&local_c88);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fc,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt64List().size())\", 0u, reader.getUInt64List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt64List().size())",
                 &local_c58,&local_c5c);
      local_c51 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)local_cb0,(Builder *)&stack0x00000008);
  uVar8 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_cb0);
  if (uVar8 != 0) {
    local_cb1 = kj::_::Debug::shouldLog(ERROR);
    while (local_cb1 != false) {
      local_cb8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
                (&local_ce8,(Builder *)&stack0x00000008);
      local_cbc = List<float,_(capnp::Kind)0>::Builder::size(&local_ce8);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fd,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getFloat32List().size())\", 0u, reader.getFloat32List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (reader.getFloat32List().size())",
                 &local_cb8,&local_cbc);
      local_cb1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)local_d10,(Builder *)&stack0x00000008);
  uVar8 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_d10);
  if (uVar8 != 0) {
    local_d11 = kj::_::Debug::shouldLog(ERROR);
    while (local_d11 != false) {
      local_d18 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
                (&local_d48,(Builder *)&stack0x00000008);
      local_d1c = List<double,_(capnp::Kind)0>::Builder::size(&local_d48);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fe,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getFloat64List().size())\", 0u, reader.getFloat64List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (reader.getFloat64List().size())",
                 &local_d18,&local_d1c);
      local_d11 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)local_d70,(Builder *)&stack0x00000008);
  uVar8 = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_d70);
  if (uVar8 != 0) {
    local_d71 = kj::_::Debug::shouldLog(ERROR);
    while (local_d71 != false) {
      local_d78 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
                (&local_da8,(Builder *)&stack0x00000008);
      local_d7c = List<capnp::Text,_(capnp::Kind)1>::Builder::size(&local_da8);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ff,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getTextList().size())\", 0u, reader.getTextList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getTextList().size())",&local_d78
                 ,&local_d7c);
      local_d71 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)local_dd0,(Builder *)&stack0x00000008);
  uVar8 = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_dd0);
  if (uVar8 != 0) {
    local_dd1 = kj::_::Debug::shouldLog(ERROR);
    while (local_dd1 != false) {
      local_dd8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
                (&local_e08,(Builder *)&stack0x00000008);
      local_ddc = List<capnp::Data,_(capnp::Kind)1>::Builder::size(&local_e08);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x200,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataList().size())\", 0u, reader.getDataList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getDataList().size())",&local_dd8
                 ,&local_ddc);
      local_dd1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)local_e30,(Builder *)&stack0x00000008);
  uVar8 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_e30);
  if (uVar8 != 0) {
    local_e31 = kj::_::Debug::shouldLog(ERROR);
    while (local_e31 != false) {
      local_e38 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
                (&local_e68,(Builder *)&stack0x00000008);
      local_e3c = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                            (&local_e68);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x201,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getStructList().size())\", 0u, reader.getStructList().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getStructList().size())",
                 &local_e38,&local_e3c);
      local_e31 = false;
    }
  }
  return;
}

Assistant:

void genericCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(false, reader.getBoolField());
  EXPECT_EQ(0, reader.getInt8Field());
  EXPECT_EQ(0, reader.getInt16Field());
  EXPECT_EQ(0, reader.getInt32Field());
  EXPECT_EQ(0, reader.getInt64Field());
  EXPECT_EQ(0u, reader.getUInt8Field());
  EXPECT_EQ(0u, reader.getUInt16Field());
  EXPECT_EQ(0u, reader.getUInt32Field());
  EXPECT_EQ(0u, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(0, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(0, reader.getFloat64Field());
  EXPECT_EQ("", reader.getTextField());
  EXPECT_EQ(data(""), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(false, subReader.getBoolField());
    EXPECT_EQ(0, subReader.getInt8Field());
    EXPECT_EQ(0, subReader.getInt16Field());
    EXPECT_EQ(0, subReader.getInt32Field());
    EXPECT_EQ(0, subReader.getInt64Field());
    EXPECT_EQ(0u, subReader.getUInt8Field());
    EXPECT_EQ(0u, subReader.getUInt16Field());
    EXPECT_EQ(0u, subReader.getUInt32Field());
    EXPECT_EQ(0u, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(0, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(0, subReader.getFloat64Field());
    EXPECT_EQ("", subReader.getTextField());
    EXPECT_EQ(data(""), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("", subSubReader.getTextField());
      EXPECT_EQ("", subSubReader.getStructField().getTextField());
    }

    EXPECT_EQ(0u, subReader.getVoidList().size());
    EXPECT_EQ(0u, subReader.getBoolList().size());
    EXPECT_EQ(0u, subReader.getInt8List().size());
    EXPECT_EQ(0u, subReader.getInt16List().size());
    EXPECT_EQ(0u, subReader.getInt32List().size());
    EXPECT_EQ(0u, subReader.getInt64List().size());
    EXPECT_EQ(0u, subReader.getUInt8List().size());
    EXPECT_EQ(0u, subReader.getUInt16List().size());
    EXPECT_EQ(0u, subReader.getUInt32List().size());
    EXPECT_EQ(0u, subReader.getUInt64List().size());
    EXPECT_EQ(0u, subReader.getFloat32List().size());
    EXPECT_EQ(0u, subReader.getFloat64List().size());
    EXPECT_EQ(0u, subReader.getTextList().size());
    EXPECT_EQ(0u, subReader.getDataList().size());
    EXPECT_EQ(0u, subReader.getStructList().size());
  }

  EXPECT_EQ(0u, reader.getVoidList().size());
  EXPECT_EQ(0u, reader.getBoolList().size());
  EXPECT_EQ(0u, reader.getInt8List().size());
  EXPECT_EQ(0u, reader.getInt16List().size());
  EXPECT_EQ(0u, reader.getInt32List().size());
  EXPECT_EQ(0u, reader.getInt64List().size());
  EXPECT_EQ(0u, reader.getUInt8List().size());
  EXPECT_EQ(0u, reader.getUInt16List().size());
  EXPECT_EQ(0u, reader.getUInt32List().size());
  EXPECT_EQ(0u, reader.getUInt64List().size());
  EXPECT_EQ(0u, reader.getFloat32List().size());
  EXPECT_EQ(0u, reader.getFloat64List().size());
  EXPECT_EQ(0u, reader.getTextList().size());
  EXPECT_EQ(0u, reader.getDataList().size());
  EXPECT_EQ(0u, reader.getStructList().size());
}